

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O3

bool libaom_examples::anon_unknown_0::parse_color_properties
               (ifstream *file,int min_indent,int *line_idx,ColorProperties *color)

{
  bool bVar1;
  int iVar2;
  ParsedValue *this;
  bool *has_list_prefix_00;
  uchar *v;
  byte bVar3;
  bool syntax_error;
  bool has_list_prefix;
  int indent;
  ParsedValue value;
  string field_name;
  
  indent = -1;
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  value.type_ = kNone;
  value.int_value_ = 0;
  value.double_value_ = 0.0;
  color->color_range = false;
  color->color_primaries = '\0';
  color->transfer_characteristics = '\0';
  color->matrix_coefficients = '\0';
  do {
    while( true ) {
      has_list_prefix_00 = &has_list_prefix;
      bVar1 = parse_line(file,min_indent,false,&indent,has_list_prefix_00,line_idx,&field_name,
                         &value,&syntax_error);
      if (!bVar1) {
        bVar3 = syntax_error ^ 1;
        goto LAB_00128936;
      }
      iVar2 = std::__cxx11::string::compare((char *)&field_name);
      if (iVar2 != 0) break;
      bVar1 = ParsedValue::IntegerValueInRange<bool>
                        ((ParsedValue *)(ulong)value.type_,value.int_value_,(ulong)(uint)*line_idx,
                         (int)color,has_list_prefix_00);
      if (!bVar1) {
        bVar3 = 0;
        goto LAB_00128936;
      }
    }
    iVar2 = std::__cxx11::string::compare((char *)&field_name);
    if (iVar2 == 0) {
      v = (uchar *)(ulong)(uint)*line_idx;
      this = (ParsedValue *)(ulong)value.type_;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&field_name);
      if (iVar2 == 0) {
        v = (uchar *)(ulong)(uint)*line_idx;
        this = (ParsedValue *)(ulong)value.type_;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&field_name);
        if (iVar2 != 0) {
          bVar3 = 0;
          fprintf(_stderr,"Error: Unknown field \'%s\' at line %d\n",field_name._M_dataplus._M_p,
                  (ulong)(uint)*line_idx);
          break;
        }
        v = (uchar *)(ulong)(uint)*line_idx;
        this = (ParsedValue *)(ulong)value.type_;
      }
    }
    bVar3 = 0;
    bVar1 = ParsedValue::IntegerValueInRange<unsigned_char>(this,value.int_value_,0,0xff,v);
  } while (bVar1);
LAB_00128936:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name._M_dataplus._M_p != &field_name.field_2) {
    operator_delete(field_name._M_dataplus._M_p);
  }
  return (bool)bVar3;
}

Assistant:

bool parse_color_properties(std::ifstream &file, int min_indent, int *line_idx,
                            ColorProperties *color) {
  bool has_list_prefix;
  int indent = -1;
  std::string field_name;
  ParsedValue value;
  bool syntax_error;
  *color = {};
  while (parse_line(file, min_indent, /*is_list=*/false, &indent,
                    &has_list_prefix, line_idx, &field_name, &value,
                    &syntax_error)) {
    if (field_name == "color_range") {
      RETURN_IF_FALSE(value.IntegerValueInRange(/*min=*/0, /*max=*/1, *line_idx,
                                                &color->color_range));
    } else if (field_name == "color_primaries") {
      if (!value.IntegerValueInRange(/*min=*/0, /*max=*/255, *line_idx,
                                     &color->color_primaries)) {
        return false;
      }
    } else if (field_name == "transfer_characteristics") {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/255, *line_idx, &color->transfer_characteristics));
    } else if (field_name == "matrix_coefficients") {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/255, *line_idx, &color->matrix_coefficients));
    } else {
      fprintf(stderr, "Error: Unknown field '%s' at line %d\n",
              field_name.c_str(), *line_idx);
      return false;
    }
  }
  if (syntax_error) return false;
  return true;
}